

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

ColumnRef __thiscall
clickhouse::ColumnVector<int>::Slice(ColumnVector<int> *this,size_t begin,size_t len)

{
  element_type *peVar1;
  size_t in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ColumnRef CVar3;
  undefined1 local_39;
  _func_int **local_38;
  element_type *peStack_30;
  vector<int,_std::allocator<int>_> local_28;
  
  SliceVector<int>(&local_28,(vector<int,_std::allocator<int>_> *)(begin + 0x28),len,in_RCX);
  std::__shared_ptr<clickhouse::ColumnVector<int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<clickhouse::ColumnVector<int>>,std::vector<int,std::allocator<int>>>
            ((__shared_ptr<clickhouse::ColumnVector<int>,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<clickhouse::ColumnVector<int>_> *)&local_39,&local_28);
  peVar1 = peStack_30;
  peStack_30 = (element_type *)0x0;
  (this->super_Column)._vptr_Column = local_38;
  (this->super_Column).super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_38 = (_func_int **)0x0;
  _Var2._M_pi = extraout_RDX;
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var2._M_pi = extraout_RDX_00;
  }
  CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Column;
  return (ColumnRef)CVar3.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnVector<T>::Slice(size_t begin, size_t len) {
    return std::make_shared<ColumnVector<T>>(SliceVector(data_, begin, len));
}